

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_target.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  allocator<char> local_39;
  Context context;
  string local_30;
  
  doctest::Context::Context(&context,0,(char **)0x0);
  if (1 < argc) {
    if ((int)*argv[1] - 0x30U < 10) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,argv[1],&local_39);
      number_trajectories = std::__cxx11::stol(&local_30,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_30);
    }
    if ((argc != 2) && ((int)*argv[2] - 0x30U < 10)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,argv[2],&local_39);
      seed = std::__cxx11::stoi(&local_30,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  doctest::Context::applyCommandLine(&context,argc,argv);
  position_random_1 = number_trajectories / 10;
  position_second_random_3 = number_trajectories / 0x19;
  if (249999 < position_second_random_3) {
    position_second_random_3 = 250000;
  }
  step_through_3 = 0;
  random_direction_3 = number_trajectories / 0x32;
  if (249999 < random_direction_3) {
    random_direction_3 = 250000;
  }
  random_discrete_3 = 250000;
  if (position_random_1 < 250000) {
    random_discrete_3 = position_random_1;
  }
  lVar3 = number_trajectories -
          (random_discrete_3 + random_direction_3 +
          (position_second_random_3 + position_random_1) * 2);
  position_random_3 = (ulong)(lVar3 * 0x5f) / 100;
  random_3_high = (ulong)(lVar3 * 5) / 100;
  velocity_random_3 = position_random_1;
  velocity_random_discrete_3 = random_discrete_3;
  velocity_second_random_3 = position_second_random_3;
  poVar2 = std::operator<<((ostream *)&std::cout,"<number_trajectories>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPosition (1 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPosition (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPosition Discrete (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPosition High Limits (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPosition Second Order (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPosition Step Through (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tVelocity (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tVelocity Discrete (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\tVelocity Second Order (3 DoF): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Total: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = doctest::Context::run(&context);
  doctest::Context::~Context(&context);
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
    doctest::Context context;

    if (argc > 1 && std::isdigit(argv[1][0])) {
        number_trajectories = std::stol(argv[1]);
    }
    if (argc > 2 && std::isdigit(argv[2][0])) {
        seed = std::stoi(argv[2]);
    }

    context.applyCommandLine(argc, argv);

    position_random_1 = number_trajectories / 10;
    position_second_random_3 = std::min<size_t>(250000, number_trajectories / 25);
    step_through_3 = 0; // number_trajectories / 20;
    random_direction_3 = std::min<size_t>(250000, number_trajectories / 50);
    random_discrete_3 = std::min<size_t>(250000, number_trajectories / 10);
    velocity_random_3 = number_trajectories / 10;
    velocity_random_discrete_3 = std::min<size_t>(250000, number_trajectories / 10);
    velocity_second_random_3 = std::min<size_t>(250000, number_trajectories / 25);

    const size_t remainder = number_trajectories - (position_random_1 + step_through_3 + random_direction_3 + velocity_random_3 + random_discrete_3 + position_second_random_3 + velocity_second_random_3); // 1. Normal, 2. High
    position_random_3 = (size_t)(remainder * 95/100);
    random_3_high = (size_t)(remainder * 5/100);

    std::cout << "<number_trajectories>" << std::endl;
    std::cout << "\tPosition (1 DoF): " << position_random_1 << std::endl;
    std::cout << "\tPosition (3 DoF): " << position_random_3 << std::endl;
    std::cout << "\tPosition Discrete (3 DoF): " << random_discrete_3 << std::endl;
    std::cout << "\tPosition High Limits (3 DoF): " << random_3_high << std::endl;
    std::cout << "\tPosition Second Order (3 DoF): " << position_second_random_3 << std::endl;
    std::cout << "\tPosition Step Through (3 DoF): " << step_through_3 << std::endl;
    std::cout << "\tVelocity (3 DoF): " << velocity_random_3 << std::endl;
    std::cout << "\tVelocity Discrete (3 DoF): " << velocity_random_discrete_3 << std::endl;
    std::cout << "\tVelocity Second Order (3 DoF): " << velocity_second_random_3 << std::endl;
    std::cout << "Total: " << number_trajectories << std::endl;

    return context.run();
}